

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-tval.c
# Opt level: O0

_Bool tval_is_edible(object *obj)

{
  object *obj_local;
  
  obj_local._7_1_ = obj->tval == '\x1c' || obj->tval == '\x1d';
  return obj_local._7_1_;
}

Assistant:

bool tval_is_edible(const struct object *obj)
{
	switch (obj->tval) {
		case TV_FOOD:
		case TV_MUSHROOM:
			return true;
		default:
			return false;
	}
}